

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kmp_ftn_entry.h
# Opt level: O0

void __kmp_api_omp_get_partition_place_nums_(int *place_nums)

{
  int iVar1;
  kmp_info_t *pkVar2;
  long in_RDI;
  kmp_info_t *thread;
  int end;
  int start;
  int last_place;
  int first_place;
  int place_num;
  int gtid;
  int i;
  int local_24;
  int local_20;
  int local_14;
  int local_c;
  
  if (__kmp_init_middle == 0) {
    __kmp_middle_initialize();
  }
  if (__kmp_affin_mask_size != 0) {
    iVar1 = __kmp_get_global_thread_id_reg();
    pkVar2 = __kmp_thread_from_gtid(iVar1);
    iVar1 = (pkVar2->th).th_first_place;
    local_20 = (pkVar2->th).th_last_place;
    if ((-1 < iVar1) && (-1 < local_20)) {
      local_24 = iVar1;
      if (iVar1 <= local_20) {
        local_24 = local_20;
        local_20 = iVar1;
      }
      local_c = 0;
      for (local_14 = local_20; local_14 <= local_24; local_14 = local_14 + 1) {
        *(int *)(in_RDI + (long)local_c * 4) = local_14;
        local_c = local_c + 1;
      }
    }
  }
  return;
}

Assistant:

void
    FTN_STDCALL KMP_EXPAND_NAME(FTN_GET_PARTITION_PLACE_NUMS)(int *place_nums) {
#if defined(KMP_STUB) || !KMP_AFFINITY_SUPPORTED
// Nothing.
#else
  int i, gtid, place_num, first_place, last_place, start, end;
  kmp_info_t *thread;
  if (!TCR_4(__kmp_init_middle)) {
    __kmp_middle_initialize();
  }
  if (!KMP_AFFINITY_CAPABLE())
    return;
  gtid = __kmp_entry_gtid();
  thread = __kmp_thread_from_gtid(gtid);
  first_place = thread->th.th_first_place;
  last_place = thread->th.th_last_place;
  if (first_place < 0 || last_place < 0)
    return;
  if (first_place <= last_place) {
    start = first_place;
    end = last_place;
  } else {
    start = last_place;
    end = first_place;
  }
  for (i = 0, place_num = start; place_num <= end; ++place_num, ++i) {
    place_nums[i] = place_num;
  }
#endif
}